

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

void __thiscall QGraphicsView::setRenderHints(QGraphicsView *this,RenderHints hints)

{
  long lVar1;
  bool bVar2;
  QGraphicsViewPrivate *pQVar3;
  QFlags<QPainter::RenderHint> in_ESI;
  QGraphicsViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QGraphicsViewPrivate *d;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QGraphicsView *)0xa37eb9);
  bVar2 = ::operator==(in_ESI,(QFlags<QPainter::RenderHint>)
                              (pQVar3->renderHints).
                              super_QFlagsStorageHelper<QPainter::RenderHint,_4>.
                              super_QFlagsStorage<QPainter::RenderHint>.i);
  if (!bVar2) {
    (pQVar3->renderHints).super_QFlagsStorageHelper<QPainter::RenderHint,_4>.
    super_QFlagsStorage<QPainter::RenderHint>.i =
         (Int)in_ESI.super_QFlagsStorageHelper<QPainter::RenderHint,_4>.
              super_QFlagsStorage<QPainter::RenderHint>.i;
    QGraphicsViewPrivate::updateAll(in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsView::setRenderHints(QPainter::RenderHints hints)
{
    Q_D(QGraphicsView);
    if (hints == d->renderHints)
        return;
    d->renderHints = hints;
    d->updateAll();
}